

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O0

double __thiscall
ChebTools::ChebyshevCollection::integrate(ChebyshevCollection *this,double xmin,double xmax)

{
  Index *pIVar1;
  const_reference pvVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 local_150 [8];
  ChebyshevExpansion I_3;
  ChebyshevExpansion I_2;
  ChebyshevExpansion I_1;
  double dStack_88;
  int i;
  double s;
  undefined1 local_70 [8];
  ChebyshevExpansion I;
  int imax;
  int imin;
  double xmax_local;
  double xmin_local;
  ChebyshevCollection *this_local;
  
  I.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows._4_4_ = get_index(this,xmin);
  I.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows._0_4_ = get_index(this,xmax);
  if ((int)I.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows ==
      I.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows._4_4_) {
    pvVar2 = std::
             vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
             operator[](&this->m_exps,
                        (long)I.m_nodal_value_cache.
                              super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows._4_4_);
    ChebyshevExpansion::integrate((ChebyshevExpansion *)local_70,pvVar2,1);
    dVar3 = ChebyshevExpansion::y((ChebyshevExpansion *)local_70,xmax);
    dVar4 = ChebyshevExpansion::y((ChebyshevExpansion *)local_70,xmin);
    this_local = (ChebyshevCollection *)(dVar3 - dVar4);
    ChebyshevExpansion::~ChebyshevExpansion((ChebyshevExpansion *)local_70);
  }
  else {
    dStack_88 = 0.0;
    I_1.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows._4_4_ = I.m_nodal_value_cache.
                   super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                   _4_4_;
    while (I_1.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows._4_4_ =
                I_1.m_nodal_value_cache.
                super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
                + 1,
          I_1.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows._4_4_ <
          (int)I.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows) {
      pvVar2 = std::
               vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
               ::operator[](&this->m_exps,
                            (long)I_1.m_nodal_value_cache.
                                  super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows._4_4_);
      pIVar1 = &I_2.m_nodal_value_cache.
                super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      ChebyshevExpansion::integrate((ChebyshevExpansion *)pIVar1,pvVar2,1);
      dVar3 = ChebyshevExpansion::xmax((ChebyshevExpansion *)pIVar1);
      dVar3 = ChebyshevExpansion::y((ChebyshevExpansion *)pIVar1,dVar3);
      pIVar1 = &I_2.m_nodal_value_cache.
                super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      dVar4 = ChebyshevExpansion::xmin((ChebyshevExpansion *)pIVar1);
      dVar4 = ChebyshevExpansion::y((ChebyshevExpansion *)pIVar1,dVar4);
      dStack_88 = (dVar3 - dVar4) + dStack_88;
      ChebyshevExpansion::~ChebyshevExpansion
                ((ChebyshevExpansion *)
                 &I_2.m_nodal_value_cache.
                  super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    }
    pvVar2 = std::
             vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
             operator[](&this->m_exps,
                        (long)I.m_nodal_value_cache.
                              super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows._4_4_);
    pIVar1 = &I_3.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
    ChebyshevExpansion::integrate((ChebyshevExpansion *)pIVar1,pvVar2,1);
    dVar3 = ChebyshevExpansion::xmax((ChebyshevExpansion *)pIVar1);
    dVar3 = ChebyshevExpansion::y((ChebyshevExpansion *)pIVar1,dVar3);
    dVar4 = ChebyshevExpansion::y
                      ((ChebyshevExpansion *)
                       &I_3.m_nodal_value_cache.
                        super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows,xmin);
    ChebyshevExpansion::~ChebyshevExpansion
              ((ChebyshevExpansion *)
               &I_3.m_nodal_value_cache.
                super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    pvVar2 = std::
             vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
             operator[](&this->m_exps,
                        (long)(int)I.m_nodal_value_cache.
                                   super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows);
    ChebyshevExpansion::integrate((ChebyshevExpansion *)local_150,pvVar2,1);
    dVar5 = ChebyshevExpansion::y((ChebyshevExpansion *)local_150,xmax);
    dVar6 = ChebyshevExpansion::xmin((ChebyshevExpansion *)local_150);
    dVar6 = ChebyshevExpansion::y((ChebyshevExpansion *)local_150,dVar6);
    this_local = (ChebyshevCollection *)((dVar5 - dVar6) + dStack_88 + (dVar3 - dVar4));
    ChebyshevExpansion::~ChebyshevExpansion((ChebyshevExpansion *)local_150);
  }
  return (double)this_local;
}

Assistant:

auto integrate(double xmin, double xmax) const {
            // Bisection to find the expansions we need
            auto imin = get_index(xmin), imax = get_index(xmax);
            if (imax == imin) {
                auto I = m_exps[imin].integrate(1);
                return I.y(xmax) - I.y(xmin);
            }
            else {
                // All the intervals between the two ones containing the limits (non-inclusive)
                // contribute the full amount, integrating from xmin to xmax
                double s = 0;
                for (auto i = imin + 1; i < imax; ++i) {
                    auto I = m_exps[i].integrate(1);
                    s += I.y(I.xmax()) - I.y(I.xmin());
                }
                // Bottom is from value to right edge
                {
                    auto I = m_exps[imin].integrate(1);
                    s += I.y(I.xmax()) - I.y(xmin);
                }
                // Top is from value to left edge
                {
                    auto I = m_exps[imax].integrate(1);
                    s += I.y(xmax) - I.y(I.xmin());
                }
                return s;
            }
        }